

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_felippa_rule.cpp
# Opt level: O0

void triangle_unit_o03(double *w,double *xy)

{
  double local_68;
  double xy_save [6];
  double w_save [3];
  int order;
  double *xy_local;
  double *w_local;
  
  xy_save[5] = 0.3333333333333333;
  memset(&local_68,0,0x30);
  local_68 = 0.6666666666666666;
  xy_save[0] = 0.16666666666666666;
  xy_save[1] = 0.16666666666666666;
  xy_save[2] = 0.6666666666666666;
  xy_save[3] = 0.16666666666666666;
  xy_save[4] = 0.16666666666666666;
  r8vec_copy(3,xy_save + 5,w);
  r8vec_copy(6,&local_68,xy);
  return;
}

Assistant:

void triangle_unit_o03 ( double w[], double xy[] )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE_UNIT_O03 returns a 3 point quadrature rule for the unit triangle.
//
//  Discussion:
//
//    This rule is precise for monomials through degree 2.
//
//    The integration region is:
//
//      0 <= X
//      0 <= Y
//      X + Y <= 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 April 2009
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Carlos Felippa,
//    A compendium of FEM integration formulas for symbolic work,
//    Engineering Computation,
//    Volume 21, Number 8, 2004, pages 867-890.
//
//  Parameters:
//
//    Output, double W[3], the weights.
//
//    Output, double XY[2*3], the abscissas.
//
{
  int order = 3;

  double w_save[3] = { 
    0.33333333333333333333, 
    0.33333333333333333333, 
    0.33333333333333333333 };
  double xy_save[2*3] = { 
    0.66666666666666666667,  0.16666666666666666667, 
    0.16666666666666666667,  0.66666666666666666667, 
    0.16666666666666666667,  0.16666666666666666667 }; 

  r8vec_copy ( order, w_save, w );
  r8vec_copy ( 2*order, xy_save, xy );

  return;
}